

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void initPyData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  QMultiHash<char,_QLatin1String> QVar4;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar5;
  long lVar6;
  char copy;
  char local_7e9;
  QMultiHash<char,_QLatin1String> local_7e8;
  iterator local_7d8;
  iterator local_7c0;
  undefined1 local_7a8;
  undefined8 local_7a0;
  char *local_798;
  undefined1 local_790;
  undefined8 local_788;
  char *local_780;
  undefined1 local_778;
  undefined8 local_770;
  char *local_768;
  undefined1 local_760;
  undefined8 local_758;
  char *local_750;
  undefined1 local_748;
  undefined8 local_740;
  char *local_738;
  undefined1 local_730;
  undefined8 local_728;
  char *local_720;
  undefined1 local_718;
  undefined8 local_710;
  char *local_708;
  undefined1 local_700;
  undefined8 local_6f8;
  char *local_6f0;
  undefined1 local_6e8;
  undefined8 local_6e0;
  char *local_6d8;
  undefined1 local_6d0;
  undefined8 local_6c8;
  char *local_6c0;
  undefined1 local_6b8;
  undefined8 local_6b0;
  char *local_6a8;
  undefined1 local_6a0;
  undefined8 local_698;
  char *local_690;
  undefined1 local_688;
  undefined8 local_680;
  char *local_678;
  undefined1 local_670;
  undefined8 local_668;
  char *local_660;
  undefined1 local_658;
  undefined8 local_650;
  char *local_648;
  undefined1 local_640;
  undefined8 local_638;
  char *local_630;
  undefined1 local_628;
  undefined8 local_620;
  char *local_618;
  undefined1 local_610;
  undefined8 local_608;
  char *local_600;
  undefined1 local_5f8;
  undefined8 local_5f0;
  char *local_5e8;
  undefined1 local_5e0;
  undefined8 local_5d8;
  char *local_5d0;
  undefined1 local_5c8;
  undefined8 local_5c0;
  char *local_5b8;
  undefined1 local_5b0;
  undefined8 local_5a8;
  char *local_5a0;
  undefined1 local_598;
  undefined8 local_590;
  char *local_588;
  undefined1 local_580;
  undefined8 local_578;
  char *local_570;
  undefined1 local_568;
  undefined8 local_560;
  char *local_558;
  undefined1 local_550;
  undefined8 local_548;
  char *local_540;
  undefined1 local_538;
  undefined8 local_530;
  char *local_528;
  undefined1 local_520;
  undefined8 local_518;
  char *local_510;
  undefined1 local_508;
  undefined8 local_500;
  char *local_4f8;
  undefined1 local_4f0;
  undefined8 local_4e8;
  char *local_4e0;
  undefined1 local_4d8;
  undefined8 local_4d0;
  char *local_4c8;
  undefined1 local_4c0;
  undefined8 local_4b8;
  char *local_4b0;
  undefined1 local_4a8;
  undefined8 local_4a0;
  char *local_498;
  undefined1 local_490;
  undefined8 local_488;
  char *local_480;
  undefined1 local_478;
  undefined8 local_470;
  char *local_468;
  undefined1 local_460;
  undefined8 local_458;
  char *local_450;
  undefined1 local_448;
  undefined8 local_440;
  char *local_438;
  undefined1 local_430;
  undefined8 local_428;
  char *local_420;
  undefined1 local_418;
  undefined8 local_410;
  char *local_408;
  undefined1 local_400;
  undefined8 local_3f8;
  char *local_3f0;
  undefined1 local_3e8;
  undefined8 local_3e0;
  char *local_3d8;
  undefined1 local_3d0;
  undefined8 local_3c8;
  char *local_3c0;
  undefined1 local_3b8;
  undefined8 local_3b0;
  char *local_3a8;
  undefined1 local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined1 local_388;
  undefined8 local_380;
  char *local_378;
  undefined1 local_370;
  undefined8 local_368;
  char *local_360;
  undefined1 local_358;
  undefined8 local_350;
  char *local_348;
  undefined1 local_340;
  undefined8 local_338;
  char *local_330;
  undefined1 local_328;
  undefined8 local_320;
  char *local_318;
  undefined1 local_310;
  undefined8 local_308;
  char *local_300;
  undefined1 local_2f8;
  undefined8 local_2f0;
  char *local_2e8;
  undefined1 local_2e0;
  undefined8 local_2d8;
  char *local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  char *local_2b8;
  undefined1 local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined1 local_298;
  undefined8 local_290;
  char *local_288;
  undefined1 local_280;
  undefined8 local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  char *local_258;
  undefined1 local_250;
  undefined8 local_248;
  char *local_240;
  undefined1 local_238;
  undefined8 local_230;
  char *local_228;
  undefined1 local_220;
  undefined8 local_218;
  char *local_210;
  undefined1 local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined1 local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined8 local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  undefined8 local_1a0;
  char *local_198;
  undefined1 local_190;
  undefined8 local_188;
  char *local_180;
  undefined1 local_178;
  undefined8 local_170;
  char *local_168;
  undefined1 local_160;
  undefined8 local_158;
  char *local_150;
  undefined1 local_148;
  undefined8 local_140;
  char *local_138;
  undefined1 local_130;
  undefined8 local_128;
  char *local_120;
  undefined1 local_118;
  undefined8 local_110;
  char *local_108;
  undefined1 local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined1 local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined1 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined1 local_a0;
  undefined8 local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  char *local_78;
  undefined1 local_70;
  undefined8 local_68;
  char *local_60;
  undefined1 local_58;
  undefined8 local_50;
  char *local_48;
  undefined1 local_40;
  undefined8 local_38;
  char *local_30;
  
  local_7c0.i.d._0_1_ = 0x61;
  local_7c0.i.bucket = 3;
  local_7c0.e = (Chain **)0x14d63b;
  local_7a8 = 0x65;
  local_7a0 = 4;
  local_798 = "elif";
  local_790 = 0x69;
  local_788 = 2;
  local_780 = "is";
  local_778 = 0x67;
  local_770 = 6;
  local_768 = "global";
  local_760 = 0x61;
  local_758 = 2;
  local_750 = "as";
  local_748 = 0x69;
  local_740 = 2;
  local_738 = "in";
  local_730 = 0x69;
  local_728 = 2;
  local_720 = "if";
  local_718 = 0x66;
  local_710 = 4;
  local_708 = "from";
  local_700 = 0x72;
  local_6f8 = 5;
  local_6f0 = "raise";
  local_6e8 = 0x66;
  local_6e0 = 3;
  local_6d8 = "for";
  local_6d0 = 0x65;
  local_6c8 = 6;
  local_6c0 = "except";
  local_6b8 = 0x66;
  local_6b0 = 7;
  local_6a8 = "finally";
  local_6a0 = 0x70;
  local_698 = 5;
  local_690 = "print";
  local_688 = 0x70;
  local_680 = 4;
  local_678 = "pass";
  local_670 = 0x72;
  local_668 = 6;
  local_660 = "return";
  local_658 = 0x65;
  local_650 = 4;
  local_648 = "exec";
  local_640 = 0x65;
  local_638 = 4;
  local_630 = "else";
  local_628 = 0x62;
  local_620 = 5;
  local_618 = "break";
  local_610 = 0x6e;
  local_608 = 3;
  local_600 = "not";
  local_5f8 = 0x77;
  local_5f0 = 4;
  local_5e8 = "with";
  local_5e0 = 99;
  local_5d8 = 5;
  local_5d0 = "class";
  local_5c8 = 0x61;
  local_5c0 = 6;
  local_5b8 = "assert";
  local_5b0 = 0x79;
  local_5a8 = 5;
  local_5a0 = "yield";
  local_598 = 0x74;
  local_590 = 3;
  local_588 = "try";
  local_580 = 0x77;
  local_578 = 5;
  local_570 = "while";
  local_568 = 99;
  local_560 = 8;
  local_558 = "continue";
  local_550 = 100;
  local_548 = 3;
  local_540 = "del";
  local_538 = 0x6f;
  local_530 = 2;
  local_528 = "or";
  local_520 = 100;
  local_518 = 3;
  local_510 = "def";
  local_508 = 0x6c;
  local_500 = 6;
  local_4f8 = "lambda";
  local_4f0 = 0x61;
  local_4e8 = 5;
  local_4e0 = "async";
  local_4d8 = 0x61;
  local_4d0 = 5;
  local_4c8 = "await";
  local_4c0 = 0x6e;
  local_4b8 = 8;
  local_4b0 = "nonlocal";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x21);
  local_7e8.m_size = 0;
  lVar6 = 0;
  local_7e8.d = pDVar5;
  do {
    local_7e9 = *(char *)((long)&local_7c0.i.d + lVar6);
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7d8,&local_7e8,&local_7e9,(QLatin1String *)((long)&local_7c0.i.bucket + lVar6)
              );
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x318);
  QVar1.m_size = local_7e8.m_size;
  QVar1.d = local_7e8.d;
  local_7e8.d = (Data *)0x0;
  local_7e8.m_size = 0;
  local_7d8.i.d = py_keywords.d;
  local_7d8.i.bucket = py_keywords.m_size;
  py_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7e8);
  local_7d8.i = (piter)ZEXT816(0);
  local_7c0.i.d = py_types.d;
  local_7c0.i.bucket = py_types.m_size;
  py_types = (QMultiHash<char,_QLatin1String>)ZEXT816(0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7d8);
  local_7c0.i.d._0_1_ = 0x46;
  local_7c0.i.bucket = 5;
  local_7c0.e = (Chain **)0x14e370;
  local_7a8 = 0x54;
  local_7a0 = 4;
  local_798 = "True";
  local_790 = 0x4e;
  local_788 = 4;
  local_780 = "None";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,3);
  local_7e8.m_size = 0;
  lVar6 = 0;
  local_7e8.d = pDVar5;
  do {
    local_7e9 = *(char *)((long)&local_7c0.i.d + lVar6);
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7d8,&local_7e8,&local_7e9,(QLatin1String *)((long)&local_7c0.i.bucket + lVar6)
              );
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  QVar2.m_size = local_7e8.m_size;
  QVar2.d = local_7e8.d;
  local_7e8.d = (Data *)0x0;
  local_7e8.m_size = 0;
  local_7d8.i.d = py_literals.d;
  local_7d8.i.bucket = py_literals.m_size;
  py_literals = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7e8);
  local_7c0.i.d._0_1_ = 0x5f;
  local_7c0.i.bucket = 10;
  local_7c0.e = (Chain **)0x14e380;
  local_7a8 = 0x61;
  local_7a0 = 3;
  local_798 = "abs";
  local_790 = 0x61;
  local_788 = 3;
  local_780 = "all";
  local_778 = 0x61;
  local_770 = 3;
  local_768 = "any";
  local_760 = 0x61;
  local_758 = 5;
  local_750 = "apply";
  local_748 = 0x61;
  local_740 = 5;
  local_738 = "ascii";
  local_730 = 0x62;
  local_728 = 10;
  local_720 = "basestring";
  local_718 = 0x62;
  local_710 = 3;
  local_708 = "bin";
  local_700 = 0x62;
  local_6f8 = 4;
  local_6f0 = "bool";
  local_6e8 = 0x62;
  local_6e0 = 6;
  local_6d8 = "buffer";
  local_6d0 = 0x62;
  local_6c8 = 9;
  local_6c0 = "bytearray";
  local_6b8 = 0x62;
  local_6b0 = 5;
  local_6a8 = "bytes";
  local_6a0 = 99;
  local_698 = 8;
  local_690 = "callable";
  local_688 = 99;
  local_680 = 3;
  local_678 = "chr";
  local_670 = 99;
  local_668 = 0xb;
  local_660 = "classmethod";
  local_658 = 99;
  local_650 = 3;
  local_648 = "cmp";
  local_640 = 99;
  local_638 = 6;
  local_630 = "coerce";
  local_628 = 99;
  local_620 = 7;
  local_618 = "compile";
  local_610 = 99;
  local_608 = 7;
  local_600 = "complex";
  local_5f8 = 100;
  local_5f0 = 7;
  local_5e8 = "delattr";
  local_5e0 = 100;
  local_5d8 = 4;
  local_5d0 = "dict";
  local_5c8 = 100;
  local_5c0 = 3;
  local_5b8 = "dir";
  local_5b0 = 100;
  local_5a8 = 6;
  local_5a0 = "divmod";
  local_598 = 0x65;
  local_590 = 9;
  local_588 = "enumerate";
  local_580 = 0x65;
  local_578 = 4;
  local_570 = "eval";
  local_568 = 0x65;
  local_560 = 8;
  local_558 = "execfile";
  local_550 = 0x66;
  local_548 = 4;
  local_540 = "file";
  local_538 = 0x66;
  local_530 = 6;
  local_528 = "filter";
  local_520 = 0x66;
  local_518 = 5;
  local_510 = "float";
  local_508 = 0x66;
  local_500 = 6;
  local_4f8 = "format";
  local_4f0 = 0x66;
  local_4e8 = 9;
  local_4e0 = "frozenset";
  local_4d8 = 0x67;
  local_4d0 = 7;
  local_4c8 = "getattr";
  local_4c0 = 0x67;
  local_4b8 = 7;
  local_4b0 = "globals";
  local_4a8 = 0x68;
  local_4a0 = 7;
  local_498 = "hasattr";
  local_490 = 0x68;
  local_488 = 4;
  local_480 = "hash";
  local_478 = 0x68;
  local_470 = 4;
  local_468 = "help";
  local_460 = 0x68;
  local_458 = 3;
  local_450 = "hex";
  local_448 = 0x69;
  local_440 = 2;
  local_438 = "id";
  local_430 = 0x69;
  local_428 = 5;
  local_420 = "input";
  local_418 = 0x69;
  local_410 = 3;
  local_408 = "int";
  local_400 = 0x69;
  local_3f8 = 6;
  local_3f0 = "intern";
  local_3e8 = 0x69;
  local_3e0 = 10;
  local_3d8 = "isinstance";
  local_3d0 = 0x69;
  local_3c8 = 10;
  local_3c0 = "issubclass";
  local_3b8 = 0x69;
  local_3b0 = 4;
  local_3a8 = "iter";
  local_3a0 = 0x6c;
  local_398 = 3;
  local_390 = "len";
  local_388 = 0x6c;
  local_380 = 4;
  local_378 = "list";
  local_370 = 0x6c;
  local_368 = 6;
  local_360 = "locals";
  local_358 = 0x6c;
  local_350 = 4;
  local_348 = "long";
  local_340 = 0x6d;
  local_338 = 3;
  local_330 = "map";
  local_328 = 0x6d;
  local_320 = 3;
  local_318 = "max";
  local_310 = 0x6d;
  local_308 = 10;
  local_300 = "memoryview";
  local_2f8 = 0x6d;
  local_2f0 = 3;
  local_2e8 = "min";
  local_2e0 = 0x6e;
  local_2d8 = 4;
  local_2d0 = "next";
  local_2c8 = 0x6f;
  local_2c0 = 6;
  local_2b8 = "object";
  local_2b0 = 0x6f;
  local_2a8 = 3;
  local_2a0 = "oct";
  local_298 = 0x6f;
  local_290 = 4;
  local_288 = "open";
  local_280 = 0x6f;
  local_278 = 3;
  local_270 = "ord";
  local_268 = 0x70;
  local_260 = 3;
  local_258 = "pow";
  local_250 = 0x70;
  local_248 = 8;
  local_240 = "property";
  local_238 = 0x72;
  local_230 = 5;
  local_228 = "range";
  local_220 = 0x72;
  local_218 = 9;
  local_210 = "raw_input";
  local_208 = 0x72;
  local_200 = 6;
  local_1f8 = "reduce";
  local_1f0 = 0x72;
  local_1e8 = 6;
  local_1e0 = "reload";
  local_1d8 = 0x72;
  local_1d0 = 4;
  local_1c8 = "repr";
  local_1c0 = 0x72;
  local_1b8 = 8;
  local_1b0 = "reversed";
  local_1a8 = 0x72;
  local_1a0 = 5;
  local_198 = "round";
  local_190 = 0x73;
  local_188 = 3;
  local_180 = "set";
  local_178 = 0x73;
  local_170 = 7;
  local_168 = "setattr";
  local_160 = 0x73;
  local_158 = 5;
  local_150 = "slice";
  local_148 = 0x73;
  local_140 = 6;
  local_138 = "sorted";
  local_130 = 0x73;
  local_128 = 0xc;
  local_120 = "staticmethod";
  local_118 = 0x73;
  local_110 = 3;
  local_108 = "str";
  local_100 = 0x73;
  local_f8 = 3;
  local_f0 = "sum";
  local_e8 = 0x73;
  local_e0 = 5;
  local_d8 = "super";
  local_d0 = 0x74;
  local_c8 = 5;
  local_c0 = "tuple";
  local_b8 = 0x74;
  local_b0 = 4;
  local_a8 = "type";
  local_a0 = 0x75;
  local_98 = 6;
  local_90 = "unichr";
  local_88 = 0x75;
  local_80 = 7;
  local_78 = "unicode";
  local_70 = 0x76;
  local_68 = 4;
  local_60 = "vars";
  local_58 = 0x78;
  local_50 = 6;
  local_48 = "xrange";
  local_40 = 0x7a;
  local_38 = 3;
  local_30 = "zip";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x51);
  local_7e8.m_size = 0;
  lVar6 = 0;
  local_7e8.d = pDVar5;
  do {
    local_7e9 = *(char *)((long)&local_7c0.i.d + lVar6);
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7d8,&local_7e8,&local_7e9,(QLatin1String *)((long)&local_7c0.i.bucket + lVar6)
              );
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x798);
  QVar3.m_size = local_7e8.m_size;
  QVar3.d = local_7e8.d;
  local_7e8.d = (Data *)0x0;
  local_7e8.m_size = 0;
  local_7d8.i.d = py_builtin.d;
  local_7d8.i.bucket = py_builtin.m_size;
  py_builtin = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7d8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7e8);
  local_7d8.i.d._0_1_ = 0x69;
  local_7d8.i.bucket = 6;
  local_7d8.e = (Chain **)0x14ff8b;
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,1);
  local_7e8.m_size = 0;
  local_7e9 = 'i';
  local_7e8.d = pDVar5;
  QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
            (&local_7c0,&local_7e8,&local_7e9,(QLatin1String *)&local_7d8.i.bucket);
  QVar4.m_size = local_7e8.m_size;
  QVar4.d = local_7e8.d;
  local_7e8.d = (Data *)0x0;
  local_7e8.m_size = 0;
  local_7c0.i.d = py_other.d;
  local_7c0.i.bucket = py_other.m_size;
  py_other = QVar4;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c0);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7e8);
  return;
}

Assistant:

void initPyData() {
    py_keywords = {
        {('a'), QLatin1String("and")},      {('e'), QLatin1String("elif")},
        {('i'), QLatin1String("is")},       {('g'), QLatin1String("global")},
        {('a'), QLatin1String("as")},       {('i'), QLatin1String("in")},
        {('i'), QLatin1String("if")},       {('f'), QLatin1String("from")},
        {('r'), QLatin1String("raise")},    {('f'), QLatin1String("for")},
        {('e'), QLatin1String("except")},   {('f'), QLatin1String("finally")},
        {('p'), QLatin1String("print")},    {('p'), QLatin1String("pass")},
        {('r'), QLatin1String("return")},   {('e'), QLatin1String("exec")},
        {('e'), QLatin1String("else")},     {('b'), QLatin1String("break")},
        {('n'), QLatin1String("not")},      {('w'), QLatin1String("with")},
        {('c'), QLatin1String("class")},    {('a'), QLatin1String("assert")},
        {('y'), QLatin1String("yield")},    {('t'), QLatin1String("try")},
        {('w'), QLatin1String("while")},    {('c'), QLatin1String("continue")},
        {('d'), QLatin1String("del")},      {('o'), QLatin1String("or")},
        {('d'), QLatin1String("def")},      {('l'), QLatin1String("lambda")},
        {('a'), QLatin1String("async")},    {('a'), QLatin1String("await")},
        {('n'), QLatin1String("nonlocal")},
    };

    py_types = {

    };

    py_literals = {{('F'), QLatin1String("False")},
                   {('T'), QLatin1String("True")},
                   {('N'), QLatin1String("None")}};

    py_builtin = {{('_'), QLatin1String("__import__")},
                  {('a'), QLatin1String("abs")},
                  {('a'), QLatin1String("all")},
                  {('a'), QLatin1String("any")},
                  {('a'), QLatin1String("apply")},
                  {('a'), QLatin1String("ascii")},
                  {('b'), QLatin1String("basestring")},
                  {('b'), QLatin1String("bin")},
                  {('b'), QLatin1String("bool")},
                  {('b'), QLatin1String("buffer")},
                  {('b'), QLatin1String("bytearray")},
                  {('b'), QLatin1String("bytes")},
                  {('c'), QLatin1String("callable")},
                  {('c'), QLatin1String("chr")},
                  {('c'), QLatin1String("classmethod")},
                  {('c'), QLatin1String("cmp")},
                  {('c'), QLatin1String("coerce")},
                  {('c'), QLatin1String("compile")},
                  {('c'), QLatin1String("complex")},
                  {('d'), QLatin1String("delattr")},
                  {('d'), QLatin1String("dict")},
                  {('d'), QLatin1String("dir")},
                  {('d'), QLatin1String("divmod")},
                  {('e'), QLatin1String("enumerate")},
                  {('e'), QLatin1String("eval")},
                  {('e'), QLatin1String("execfile")},
                  {('f'), QLatin1String("file")},
                  {('f'), QLatin1String("filter")},
                  {('f'), QLatin1String("float")},
                  {('f'), QLatin1String("format")},
                  {('f'), QLatin1String("frozenset")},
                  {('g'), QLatin1String("getattr")},
                  {('g'), QLatin1String("globals")},
                  {('h'), QLatin1String("hasattr")},
                  {('h'), QLatin1String("hash")},
                  {('h'), QLatin1String("help")},
                  {('h'), QLatin1String("hex")},
                  {('i'), QLatin1String("id")},
                  {('i'), QLatin1String("input")},
                  {('i'), QLatin1String("int")},
                  {('i'), QLatin1String("intern")},
                  {('i'), QLatin1String("isinstance")},
                  {('i'), QLatin1String("issubclass")},
                  {('i'), QLatin1String("iter")},
                  {('l'), QLatin1String("len")},
                  {('l'), QLatin1String("list")},
                  {('l'), QLatin1String("locals")},
                  {('l'), QLatin1String("long")},
                  {('m'), QLatin1String("map")},
                  {('m'), QLatin1String("max")},
                  {('m'), QLatin1String("memoryview")},
                  {('m'), QLatin1String("min")},
                  {('n'), QLatin1String("next")},
                  {('o'), QLatin1String("object")},
                  {('o'), QLatin1String("oct")},
                  {('o'), QLatin1String("open")},
                  {('o'), QLatin1String("ord")},
                  {('p'), QLatin1String("pow")},
                  {('p'), QLatin1String("property")},
                  {('r'), QLatin1String("range")},
                  {('r'), QLatin1String("raw_input")},
                  {('r'), QLatin1String("reduce")},
                  {('r'), QLatin1String("reload")},
                  {('r'), QLatin1String("repr")},
                  {('r'), QLatin1String("reversed")},
                  {('r'), QLatin1String("round")},
                  {('s'), QLatin1String("set")},
                  {('s'), QLatin1String("setattr")},
                  {('s'), QLatin1String("slice")},
                  {('s'), QLatin1String("sorted")},
                  {('s'), QLatin1String("staticmethod")},
                  {('s'), QLatin1String("str")},
                  {('s'), QLatin1String("sum")},
                  {('s'), QLatin1String("super")},
                  {('t'), QLatin1String("tuple")},
                  {('t'), QLatin1String("type")},
                  {('u'), QLatin1String("unichr")},
                  {('u'), QLatin1String("unicode")},
                  {('v'), QLatin1String("vars")},
                  {('x'), QLatin1String("xrange")},
                  {('z'), QLatin1String("zip")}};

    py_other = {{('i'), QLatin1String("import")}};
}